

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.cpp
# Opt level: O3

int ply_check_word(p_ply ply)

{
  size_t sVar1;
  char *fmt;
  
  sVar1 = strlen(ply->buffer + ply->buffer_token);
  if (sVar1 < 0x100) {
    if (sVar1 != 0) {
      return 1;
    }
    fmt = "Unexpected end of file";
  }
  else {
    fmt = "Word too long";
  }
  ply_ferror(ply,fmt);
  return 0;
}

Assistant:

static int ply_check_word(p_ply ply) {
    size_t size = strlen(BWORD(ply));
    if (size >= WORDSIZE) {
        ply_ferror(ply, "Word too long");
        return 0;
    } else if (size == 0) {
        ply_ferror(ply, "Unexpected end of file");
        return 0;
    }
    return 1;
}